

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O2

void find_suite::find_if(void)

{
  bool bVar1;
  difference_type dVar2;
  size_type extraout_RDX;
  size_type sVar3;
  size_type extraout_RDX_00;
  size_type extraout_RDX_01;
  size_type extraout_RDX_02;
  size_type extraout_RDX_03;
  size_type extraout_RDX_04;
  size_type extraout_RDX_05;
  size_type extraout_RDX_06;
  basic_iterator<int> *pbVar4;
  long lVar5;
  initializer_list<int> input;
  basic_iterator<int> bVar6;
  basic_iterator<int> __it;
  basic_iterator<int> __it_00;
  basic_iterator<int> __it_01;
  basic_iterator<int> __it_02;
  basic_iterator<int> __it_03;
  basic_iterator<int> __it_04;
  initializer_list<int> __l;
  iterator iVar7;
  allocator_type local_99;
  vector<int,_std::allocator<int>_> expect;
  iterator local_68;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x2c00000021;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  input._M_len = 4;
  input._M_array = (iterator)&expect;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  iVar7 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  local_68 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_16_ =
       iVar7;
  dVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator-
                    (&local_68,(iterator_type *)&expect);
  sVar3 = extraout_RDX;
  for (lVar5 = dVar2 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
    bVar6.current = sVar3;
    bVar6.parent = (view_pointer)
                   expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<find_suite::find_if()::$_0>::operator()
                      ((_Iter_pred<find_suite::find_if()::__0> *)
                       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,bVar6);
    pbVar4 = (basic_iterator<int> *)&expect;
    if (bVar1) goto LAB_00102bcf;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
              ((basic_iterator<int> *)&expect);
    __it.current = extraout_RDX_00;
    __it.parent = (view_pointer)
                  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<find_suite::find_if()::$_0>::operator()
                      ((_Iter_pred<find_suite::find_if()::__0> *)
                       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,__it);
    if (bVar1) goto LAB_00102bcf;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
              ((basic_iterator<int> *)&expect);
    __it_00.current = extraout_RDX_01;
    __it_00.parent =
         (view_pointer)
         expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<find_suite::find_if()::$_0>::operator()
                      ((_Iter_pred<find_suite::find_if()::__0> *)
                       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,__it_00);
    if (bVar1) goto LAB_00102bcf;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
              ((basic_iterator<int> *)&expect);
    __it_01.current = extraout_RDX_02;
    __it_01.parent =
         (view_pointer)
         expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<find_suite::find_if()::$_0>::operator()
                      ((_Iter_pred<find_suite::find_if()::__0> *)
                       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,__it_01);
    if (bVar1) goto LAB_00102bcf;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
              ((basic_iterator<int> *)&expect);
    sVar3 = extraout_RDX_03;
  }
  dVar2 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator-
                    (&local_68,(iterator_type *)&expect);
  sVar3 = extraout_RDX_04;
  if (dVar2 != 1) {
    if (dVar2 != 2) {
      pbVar4 = &local_68;
      if (dVar2 != 3) goto LAB_00102bcf;
      __it_02.current = extraout_RDX_04;
      __it_02.parent =
           (view_pointer)
           expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
      bVar1 = __gnu_cxx::__ops::_Iter_pred<find_suite::find_if()::$_0>::operator()
                        ((_Iter_pred<find_suite::find_if()::__0> *)
                         expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,__it_02);
      pbVar4 = (iterator_type *)&expect;
      if (bVar1) goto LAB_00102bcf;
      vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
                ((basic_iterator<int> *)&expect);
      sVar3 = extraout_RDX_05;
    }
    __it_03.current = sVar3;
    __it_03.parent =
         (view_pointer)
         expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    bVar1 = __gnu_cxx::__ops::_Iter_pred<find_suite::find_if()::$_0>::operator()
                      ((_Iter_pred<find_suite::find_if()::__0> *)
                       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,__it_03);
    pbVar4 = (iterator_type *)&expect;
    if (bVar1) goto LAB_00102bcf;
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
              ((basic_iterator<int> *)&expect);
    sVar3 = extraout_RDX_06;
  }
  __it_04.current = sVar3;
  __it_04.parent =
       (view_pointer)
       expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  bVar1 = __gnu_cxx::__ops::_Iter_pred<find_suite::find_if()::$_0>::operator()
                    ((_Iter_pred<find_suite::find_if()::__0> *)
                     expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,__it_04);
  pbVar4 = (iterator_type *)&expect;
  if (!bVar1) {
    vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator++
              ((basic_iterator<int> *)&expect);
    pbVar4 = &local_68;
  }
LAB_00102bcf:
  bVar6 = *pbVar4;
  local_68.parent = (view_pointer)0x2c00000021;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_68;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_99);
  iVar7 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x13e,"void find_suite::find_if()",bVar6,iVar7,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void find_if()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44 };
    auto where = std::find_if(span.begin(), span.end(), [](int value){ return value > 22; });
    {
        std::vector<int> expect = { 33, 44 };
        BOOST_TEST_ALL_EQ(where, span.end(),
                          expect.begin(), expect.end());
    }
}